

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

CURLcode Curl_conn_shutdown(Curl_easy *data,int sockindex,_Bool *done)

{
  curl_trc_feat *pcVar1;
  bool bVar2;
  _Bool _Var3;
  timediff_t tVar4;
  char *pcVar5;
  CURLcode CVar6;
  CURLcode unaff_R13D;
  Curl_cfilter *cf;
  curltime cVar7;
  _Bool cfdone;
  char local_49;
  _Bool *local_48;
  curltime local_40;
  
  cf = data->conn->cfilter[sockindex];
  while( true ) {
    if (cf == (Curl_cfilter *)0x0) {
      *done = true;
      return CURLE_OK;
    }
    if ((cf->field_0x24 & 3) == 1) break;
    cf = cf->next;
  }
  *done = false;
  cVar7 = Curl_now();
  local_40.tv_sec = cVar7.tv_sec;
  local_40.tv_usec = cVar7.tv_usec;
  _Var3 = Curl_shutdown_started(data,sockindex);
  if (_Var3) {
    tVar4 = Curl_shutdown_timeleft(data->conn,sockindex,&local_40);
    if (tVar4 < 0) {
      if (data == (Curl_easy *)0x0) {
        return CURLE_OPERATION_TIMEDOUT;
      }
      if (((data->set).field_0x89f & 0x40) == 0) {
        return CURLE_OPERATION_TIMEDOUT;
      }
      pcVar1 = (data->state).feat;
      if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
        return CURLE_OPERATION_TIMEDOUT;
      }
      Curl_infof(data,"shutdown timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_multi.log_level)) {
      pcVar5 = " secondary";
      if (sockindex == 0) {
        pcVar5 = "";
      }
      Curl_trc_multi(data,"shutdown start on%s connection",pcVar5);
    }
    Curl_shutdown_start(data,sockindex,0,&local_40);
  }
  CVar6 = CURLE_OK;
  local_48 = done;
  do {
    if ((cf->field_0x24 & 2) == 0) {
      local_49 = '\0';
      CVar6 = (*(code *)cf->cft->do_shutdown)(cf,data,&local_49);
      if (CVar6 == CURLE_OK) {
        if (local_49 == '\0') {
          if (data != (Curl_easy *)0x0) {
            bVar2 = false;
            unaff_R13D = CURLE_OK;
            if (((data->set).field_0x89f & 0x40) == 0) goto LAB_00118dd8;
            pcVar1 = (data->state).feat;
            if (((pcVar1 == (curl_trc_feat *)0x0) || (0 < pcVar1->log_level)) &&
               (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,"shut down not done yet");
            }
          }
          bVar2 = false;
          unaff_R13D = CURLE_OK;
        }
        else {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
              ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
               (0 < pcVar1->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"shut down successfully");
          }
          cf->field_0x24 = cf->field_0x24 | 2;
          bVar2 = true;
        }
      }
      else {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ) && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"shut down failed with %d",(ulong)CVar6);
        }
        bVar2 = false;
        unaff_R13D = CVar6;
      }
LAB_00118dd8:
      if (!bVar2) {
        return unaff_R13D;
      }
    }
    cf = cf->next;
    if (cf == (Curl_cfilter *)0x0) {
      *local_48 = CVar6 == CURLE_OK;
      return CVar6;
    }
  } while( true );
}

Assistant:

CURLcode Curl_conn_shutdown(struct Curl_easy *data, int sockindex, bool *done)
{
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  struct curltime now;

  DEBUGASSERT(data->conn);
  /* Get the first connected filter that is not shut down already. */
  cf = data->conn->cfilter[sockindex];
  while(cf && (!cf->connected || cf->shutdown))
    cf = cf->next;

  if(!cf) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  if(!Curl_shutdown_started(data, sockindex)) {
    CURL_TRC_M(data, "shutdown start on%s connection",
               sockindex ? " secondary" : "");
    Curl_shutdown_start(data, sockindex, 0, &now);
  }
  else {
    timeout_ms = Curl_shutdown_timeleft(data->conn, sockindex, &now);
    if(timeout_ms < 0) {
      /* info message, since this might be regarded as acceptable */
      infof(data, "shutdown timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
  }

  while(cf) {
    if(!cf->shutdown) {
      bool cfdone = FALSE;
      result = cf->cft->do_shutdown(cf, data, &cfdone);
      if(result) {
        CURL_TRC_CF(data, cf, "shut down failed with %d", result);
        return result;
      }
      else if(!cfdone) {
        CURL_TRC_CF(data, cf, "shut down not done yet");
        return CURLE_OK;
      }
      CURL_TRC_CF(data, cf, "shut down successfully");
      cf->shutdown = TRUE;
    }
    cf = cf->next;
  }
  *done = (!result);
  return result;
}